

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave.c
# Opt level: O2

void borg_init_cave(void)

{
  void *pvVar1;
  long lVar2;
  
  if ((z_info->dungeon_wid != 0xc6) || (z_info->dungeon_hgt != 0x42)) {
    borg_note("**STARTUP FAILURE** dungeon size miss match");
    borg_init_failure = true;
  }
  for (lVar2 = 0; lVar2 != 0x210; lVar2 = lVar2 + 8) {
    pvVar1 = mem_zalloc(0x948);
    *(void **)((long)borg_grids + lVar2) = pvVar1;
  }
  return;
}

Assistant:

void borg_init_cave(void)
{
    /* sanity check  */
    if (DUNGEON_WID != z_info->dungeon_wid
        || DUNGEON_HGT != z_info->dungeon_hgt) {
        borg_note("**STARTUP FAILURE** dungeon size miss match");
        borg_init_failure = true;
    }

    /* Make each row of grids */
    for (int y = 0; y < AUTO_MAX_Y; y++) {
        /* Make each row */
        borg_grids[y] = mem_zalloc(AUTO_MAX_X * sizeof(borg_grid));
    }
}